

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall
RealCommandRunner::WaitForCommand(RealCommandRunner *this,Result *result,bool more_ready)

{
  bool bVar1;
  ExitStatus EVar2;
  Subprocess *pSVar3;
  iterator __position;
  TokenPool *tokens;
  Subprocess *local_30;
  
  (this->subprocs_).token_available_ = false;
  while( true ) {
    pSVar3 = SubprocessSet::NextFinished(&this->subprocs_);
    if (pSVar3 != (Subprocess *)0x0) {
      local_30 = pSVar3;
      if (this->tokens_ != (TokenPool *)0x0) {
        (*this->tokens_->_vptr_TokenPool[4])();
      }
      EVar2 = Subprocess::Finish(pSVar3);
      result->status = EVar2;
      Subprocess::GetOutput_abi_cxx11_(pSVar3);
      std::__cxx11::string::_M_assign((string *)&result->output);
      __position = std::
                   _Rb_tree<const_Subprocess_*,_std::pair<const_Subprocess_*const,_Edge_*>,_std::_Select1st<std::pair<const_Subprocess_*const,_Edge_*>_>,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
                   ::find(&(this->subproc_to_edge_)._M_t,&local_30);
      result->edge = (Edge *)__position._M_node[1]._M_parent;
      std::
      _Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
      ::erase_abi_cxx11_((_Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                          *)&this->subproc_to_edge_,__position);
      pSVar3 = local_30;
      if (local_30 != (Subprocess *)0x0) {
        Subprocess::~Subprocess(local_30);
      }
      operator_delete(pSVar3,0x30);
      return true;
    }
    if ((this->subprocs_).token_available_ != false) break;
    if (more_ready) {
      tokens = this->tokens_;
    }
    else {
      tokens = (TokenPool *)0x0;
    }
    bVar1 = SubprocessSet::DoWork(&this->subprocs_,tokens);
    if (bVar1) {
      return false;
    }
  }
  result->status = ExitTokenAvailable;
  return true;
}

Assistant:

bool RealCommandRunner::WaitForCommand(Result* result, bool more_ready) {
  Subprocess* subproc;
  subprocs_.ResetTokenAvailable();
  while (((subproc = subprocs_.NextFinished()) == NULL) &&
         !subprocs_.IsTokenAvailable()) {
    bool interrupted = subprocs_.DoWork(more_ready ? tokens_ : NULL);
    if (interrupted)
      return false;
  }

  // token became available
  if (subproc == NULL) {
    result->status = ExitTokenAvailable;
    return true;
  }

  // command completed
  if (tokens_)
    tokens_->Release();

  result->status = subproc->Finish();
  result->output = subproc->GetOutput();

  map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.find(subproc);
  result->edge = e->second;
  subproc_to_edge_.erase(e);

  delete subproc;
  return true;
}